

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label,ImGuiWindow *docked_window)

{
  ImGuiID IVar1;
  
  if (docked_window == (ImGuiWindow *)0x0) {
    IVar1 = ImGuiWindow::GetID(GImGui->CurrentWindow,label,(char *)0x0);
    return IVar1;
  }
  if ((tab_bar->Flags & 0x100000) != 0) {
    IVar1 = ImHashStr(label,0,0);
    KeepAliveID(IVar1);
    return IVar1;
  }
  __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                ,0x1d77,"ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *, const char *, ImGuiWindow *)");
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label, ImGuiWindow* docked_window)
{
    if (docked_window != NULL)
    {
        IM_UNUSED(tab_bar);
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}